

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

Type * __thiscall
slang::ast::GenericClassDefSymbol::getSpecialization
          (GenericClassDefSymbol *this,ASTContext *context,ParameterValueAssignmentSyntax *syntax)

{
  Compilation *this_00;
  SyntaxNode *in_RDX;
  Type *result;
  ParameterValueAssignmentSyntax *in_stack_00000538;
  undefined1 in_stack_00000547;
  ASTContext *in_stack_00000548;
  GenericClassDefSymbol *in_stack_00000550;
  SourceLocation in_stack_00000558;
  Token local_40;
  SourceLocation local_30;
  Type *local_28;
  Type *local_8;
  
  local_40 = slang::syntax::SyntaxNode::getFirstToken(in_RDX);
  local_30 = parsing::Token::location(&local_40);
  local_28 = getSpecializationImpl
                       (in_stack_00000550,in_stack_00000548,in_stack_00000558,
                        (bool)in_stack_00000547,in_stack_00000538);
  local_8 = local_28;
  if (local_28 == (Type *)0x0) {
    this_00 = ASTContext::getCompilation((ASTContext *)0x89e0cc);
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& GenericClassDefSymbol::getSpecialization(
    const ASTContext& context, const ParameterValueAssignmentSyntax& syntax) const {

    auto result = getSpecializationImpl(context, syntax.getFirstToken().location(),
                                        /* forceInvalidParams */ false, &syntax);
    if (!result)
        return context.getCompilation().getErrorType();

    return *result;
}